

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

double norm2(double *array,int N)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  dVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + array[uVar1] * array[uVar1];
  }
  if (0.0 <= dVar3) {
    return SQRT(dVar3);
  }
  dVar3 = sqrt(dVar3);
  return dVar3;
}

Assistant:

double norm2(double *array, int N) {
	int i;
	double nrm;
	
	nrm = 0.0;
	for (i = 0; i < N; ++i) {
		nrm += array[i]*array[i];
	}
	nrm = sqrt(nrm);
	return nrm;
}